

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O3

void MListRemove(Col_Word *nodePtr,size_t first,size_t last)

{
  ulong last_00;
  size_t sVar1;
  Col_Word CVar2;
  Col_Word right;
  uint uVar3;
  size_t sVar4;
  ulong length;
  byte *mvector;
  MergeListChunksInfo info;
  undefined8 local_40;
  Col_Word local_38;
  
  sVar1 = Col_ListLength(*nodePtr);
  last_00 = sVar1 - 1;
  if (last_00 == last && first == 0) {
    *nodePtr = 0x14;
    return;
  }
  length = ~last + first + sVar1;
  do {
    mvector = (byte *)*nodePtr;
    if (mvector == (byte *)0x0) {
      uVar3 = 0;
    }
    else {
      if (((ulong)mvector & 0xf) == 0) {
        uVar3 = 0xffffffff;
        if ((*mvector & 2) == 0) goto LAB_00111942;
        uVar3 = *mvector & 0xfffffffe;
      }
      else {
        uVar3 = immediateWordTypes[(uint)mvector & 0x1f];
      }
      if (uVar3 == 0xfffffff9) {
        *nodePtr = length * 0x20 | 0x14;
        return;
      }
      if (uVar3 == 0x1a) {
        if (last < last_00) {
          memmove(mvector + first * 8 + 0x10,mvector + last * 8 + 0x18,(sVar1 + ~last) * 8);
          mvector = (byte *)*nodePtr;
        }
        Col_MVectorSetLength((Col_Word)mvector,length);
        return;
      }
      if (uVar3 == 0x26) {
        sVar1 = (size_t)*(ushort *)(mvector + 2);
        if (sVar1 == 0) {
          sVar1 = Col_ListLength(*(Col_Word *)(mvector + 0x10));
        }
        if (sVar1 <= last) {
          sVar4 = 0;
          if (sVar1 <= first) {
            sVar4 = first - sVar1;
          }
          MListRemove((Col_Word *)(*nodePtr + 0x18),sVar4,last - sVar1);
        }
        if (first < sVar1) {
          sVar4 = sVar1 - 1;
          if (last < sVar1) {
            sVar4 = last;
          }
          MListRemove((Col_Word *)(*nodePtr + 0x10),first,sVar4);
          sVar1 = Col_ListLength(*(Col_Word *)(*nodePtr + 0x10));
        }
        if (sVar1 != 0) {
          sVar1 = Col_ListLength(*(Col_Word *)(*nodePtr + 0x18));
          if (sVar1 == 0) {
            *nodePtr = *(Col_Word *)(*nodePtr + 0x10);
            return;
          }
          UpdateMConcatNode(*nodePtr);
          return;
        }
        *nodePtr = *(Col_Word *)(*nodePtr + 0x18);
        return;
      }
    }
LAB_00111942:
    if (length < 0x27) {
      CVar2 = Col_NewMVector(0,length,(Col_Word *)0x0);
      local_40 = 0;
      local_38 = CVar2;
      Col_TraverseListChunks(*nodePtr,0,first,0,MergeListChunksProc,&local_40,(size_t *)0x0);
      Col_TraverseListChunks
                (*nodePtr,last + 1,sVar1 - last,0,MergeListChunksProc,&local_40,(size_t *)0x0);
      *nodePtr = CVar2;
      return;
    }
    if (uVar3 == 0x1e) {
      if (mvector[1] == 0) {
LAB_001119cd:
        if (first == 0) {
          CVar2 = Col_Sublist((Col_Word)mvector,last + 1,last_00);
        }
        else {
          CVar2 = Col_Sublist((Col_Word)mvector,0,first - 1);
          if (last < last_00) {
            right = Col_Sublist(*nodePtr,last + 1,last_00);
            CVar2 = NewMConcatList(CVar2,right);
          }
        }
        *nodePtr = CVar2;
        return;
      }
    }
    else if (uVar3 != 0x22) goto LAB_001119cd;
    ConvertToMConcatNode(nodePtr);
  } while( true );
}

Assistant:

static void
MListRemove(
    Col_Word * nodePtr, /*!< [in,out] Mutable list node to modify. May be
                             overwritten in the process (e.g. if it gets
                             converted to mutable). */
    size_t first,       /*!< Index of first element in range to remove. */
    size_t last)        /*!< Index of last element in range to remove. */
{
    size_t length = Col_ListLength(*nodePtr);
    Col_Word node;
    int type;

    ASSERT(first <= last);
    ASSERT(last < length);

    if (first == 0 && last == length-1) {
        /*
         * Delete all content.
         */

        *nodePtr = WORD_LIST_EMPTY;
        return;
    }

    /*
     * Entry point for tail recursive calls.
     */

start:

    /*
     * First alter mutable types.
     */

    type = WORD_TYPE(*nodePtr);
    switch (type) {
    case WORD_TYPE_MCONCATLIST: {
        size_t leftLength = WORD_CONCATLIST_LEFT_LENGTH(*nodePtr);
        if (leftLength == 0) {
            leftLength = Col_ListLength(WORD_CONCATLIST_LEFT(*nodePtr));
        }

        if (last >= leftLength) {
            /*
             * Remove part on right arm.
             */

            MListRemove(&WORD_CONCATLIST_RIGHT(*nodePtr),
                    (first<leftLength?0:first-leftLength), last-leftLength);
        }
        if (first < leftLength) {
            /*
             * Remove part on left arm.
             */

            MListRemove(&WORD_CONCATLIST_LEFT(*nodePtr), first,
                    (last<leftLength?last:leftLength-1));
            leftLength = Col_ListLength(WORD_CONCATLIST_LEFT(*nodePtr));
        }

        if (leftLength == 0) {
            /*
             * Whole left arm removed, replace node by right.
             */

            *nodePtr = WORD_CONCATLIST_RIGHT(*nodePtr);
        } else if (Col_ListLength(WORD_CONCATLIST_RIGHT(*nodePtr))
                == 0) {
            /*
             * Whole right arm removed, replace node by left.
             */

            *nodePtr = WORD_CONCATLIST_LEFT(*nodePtr);
        } else {
            /*
             * Update & rebalance node.
             */

            UpdateMConcatNode(*nodePtr);
        }
        return;
        }

    case WORD_TYPE_MVECTOR:
        if (last < length-1) {
            /*
             * Move trailing elements.
             */

            Col_Word *elements = WORD_VECTOR_ELEMENTS(*nodePtr);
            memmove(elements+first, elements+last+1, (length-last-1)
                    * sizeof(*elements));
        }

        /*
         * Shorten mutable vector, keeping reserved size.
         */

        Col_MVectorSetLength(*nodePtr, length - (last-first+1));
        return;

    case WORD_TYPE_VOIDLIST:
        /*
         * Shorten void list.
         */

        *nodePtr = WORD_VOIDLIST_NEW(length - (last-first+1));
        return;
    }

    if (length - (last-first+1) <= MAX_SHORT_MVECTOR_LENGTH) {
        /*
         * Merge all chunks into one mutable vector for short lists.
         * TODO: geometric growth?
         */

        MergeListChunksInfo info;

        node = Col_NewMVector(0, length - (last-first+1), NULL);

        info.length = 0;
        info.vector = node;
        Col_TraverseListChunks(*nodePtr, 0, first, 0, MergeListChunksProc,
                &info, NULL);
        Col_TraverseListChunks(*nodePtr, last+1, length-last, 0,
                MergeListChunksProc, &info, NULL);
        ASSERT(info.length == length-(last-first+1));

        *nodePtr = node;
        return;
    }

    /*
     * General case with immutable types.
     */

    switch (type) {
    case WORD_TYPE_CONCATLIST:
        /*
         * Convert to mutable concat then retry.
         */

        ConvertToMConcatNode(nodePtr);
        goto start;

    case WORD_TYPE_SUBLIST:
        if (WORD_SUBLIST_DEPTH(*nodePtr) >= 1) {
            /*
             * Source is concat. Convert to mutable concat then retry.
             */

            ConvertToMConcatNode(nodePtr);
            goto start;
        }
        /* continued. */
    default:
        if (first == 0) {
            /*
             * Remove head: keep tail.
             */

            node = Col_Sublist(*nodePtr, last+1, length-1);
        } else if (last >= length-1) {
            /*
             * Remove tail: keep head.
             */

            node = Col_Sublist(*nodePtr, 0, first-1);
        } else {
            /*
             * Merge head & tail into a mutable concat.
             */

            node = NewMConcatList(Col_Sublist(*nodePtr, 0, first-1),
                    Col_Sublist(*nodePtr, last+1, length-1));
        }
        *nodePtr = node;
        return;
    }
}